

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int assign_mv(AV1_COMMON *cm,MACROBLOCKD *xd,PREDICTION_MODE mode,MV_REFERENCE_FRAME *ref_frame,
             int_mv *mv,int_mv *ref_mv,int_mv *nearest_mv,int_mv *near_mv,int is_compound,
             int allow_hp,aom_reader *r)

{
  int_mv iVar1;
  int iVar2;
  MV *mv_00;
  byte in_DL;
  long in_RDI;
  int_mv *in_R8;
  int_mv *in_stack_00000008;
  int_mv *in_stack_00000010;
  int in_stack_00000018;
  int ret;
  undefined4 in_stack_00000020;
  nmv_context *nmvc_5;
  nmv_context *nmvc_4;
  nmv_context *nmvc_3;
  nmv_context *nmvc_2;
  nmv_context *nmvc_1;
  int i;
  nmv_context *nmvc;
  FeatureFlags *features;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *mbmi;
  FRAME_CONTEXT *ec_ctx;
  nmv_context *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  bool bVar3;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  BLOCK_SIZE bsize_00;
  undefined8 in_stack_ffffffffffffff70;
  WarpedMotionParams *in_stack_ffffffffffffff78;
  int local_68;
  uint local_4;
  
  if ((*(byte *)(in_RDI + 0x1ee) & 1) != 0) {
    in_stack_00000020 = 0xffffffff;
  }
  mv_00 = (MV *)(ulong)(in_DL - 0xd);
  bsize_00 = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff70 >> 0x18);
  iVar2 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  switch(mv_00) {
  case (MV *)0x0:
    *in_R8 = *in_stack_00000008;
    break;
  case (MV *)0x1:
    *in_R8 = *in_stack_00000010;
    break;
  case (MV *)0x2:
    iVar1 = gm_get_motion_vector
                      (in_stack_ffffffffffffff78,iVar2,bsize_00,in_stack_ffffffffffffff6c,
                       in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    *in_R8 = iVar1;
    break;
  case (MV *)0x3:
    read_mv((aom_reader *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),mv_00,
            (MV *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
            in_stack_ffffffffffffff48,'\0');
    break;
  case (MV *)0x4:
    *in_R8 = *in_stack_00000008;
    in_R8[1] = in_stack_00000008[1];
    break;
  case (MV *)0x5:
    *in_R8 = *in_stack_00000010;
    in_R8[1] = in_stack_00000010[1];
    break;
  case (MV *)0x6:
    *in_R8 = *in_stack_00000008;
    read_mv((aom_reader *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),mv_00,
            (MV *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
            in_stack_ffffffffffffff48,'\0');
    break;
  case (MV *)0x7:
    read_mv((aom_reader *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),mv_00,
            (MV *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
            in_stack_ffffffffffffff48,'\0');
    in_R8[1] = in_stack_00000008[1];
    break;
  case (MV *)0x8:
    *in_R8 = *in_stack_00000010;
    read_mv((aom_reader *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),mv_00,
            (MV *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
            in_stack_ffffffffffffff48,'\0');
    break;
  case (MV *)0x9:
    read_mv((aom_reader *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),mv_00,
            (MV *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
            in_stack_ffffffffffffff48,'\0');
    in_R8[1] = in_stack_00000010[1];
    break;
  case (MV *)0xa:
    iVar1 = gm_get_motion_vector
                      (in_stack_ffffffffffffff78,iVar2,bsize_00,in_stack_ffffffffffffff6c,
                       in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    *in_R8 = iVar1;
    iVar1 = gm_get_motion_vector
                      (in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                       (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff70 >> 0x18),iVar1.as_int,
                       in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    in_R8[1] = iVar1;
    break;
  case (MV *)0xb:
    for (local_68 = 0; local_68 < 2; local_68 = local_68 + 1) {
      read_mv((aom_reader *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),mv_00,
              (MV *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff48,'\0');
    }
    break;
  default:
    return 0;
  }
  local_4 = is_mv_valid(&in_R8->as_mv);
  if (in_stack_00000018 != 0) {
    bVar3 = false;
    if (local_4 != 0) {
      iVar2 = is_mv_valid(&in_R8[1].as_mv);
      bVar3 = iVar2 != 0;
    }
    local_4 = (uint)bVar3;
  }
  return local_4;
}

Assistant:

static inline int assign_mv(AV1_COMMON *cm, MACROBLOCKD *xd,
                            PREDICTION_MODE mode,
                            MV_REFERENCE_FRAME ref_frame[2], int_mv mv[2],
                            int_mv ref_mv[2], int_mv nearest_mv[2],
                            int_mv near_mv[2], int is_compound, int allow_hp,
                            aom_reader *r) {
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  MB_MODE_INFO *mbmi = xd->mi[0];
  BLOCK_SIZE bsize = mbmi->bsize;
  FeatureFlags *const features = &cm->features;
  if (features->cur_frame_force_integer_mv) {
    allow_hp = MV_SUBPEL_NONE;
  }
  switch (mode) {
    case NEWMV: {
      nmv_context *const nmvc = &ec_ctx->nmvc;
      read_mv(r, &mv[0].as_mv, &ref_mv[0].as_mv, nmvc, allow_hp);
      break;
    }
    case NEARESTMV: {
      mv[0].as_int = nearest_mv[0].as_int;
      break;
    }
    case NEARMV: {
      mv[0].as_int = near_mv[0].as_int;
      break;
    }
    case GLOBALMV: {
      mv[0].as_int = gm_get_motion_vector(&cm->global_motion[ref_frame[0]],
                                          features->allow_high_precision_mv,
                                          bsize, xd->mi_col, xd->mi_row,
                                          features->cur_frame_force_integer_mv)
                         .as_int;
      break;
    }
    case NEW_NEWMV: {
      assert(is_compound);
      for (int i = 0; i < 2; ++i) {
        nmv_context *const nmvc = &ec_ctx->nmvc;
        read_mv(r, &mv[i].as_mv, &ref_mv[i].as_mv, nmvc, allow_hp);
      }
      break;
    }
    case NEAREST_NEARESTMV: {
      assert(is_compound);
      mv[0].as_int = nearest_mv[0].as_int;
      mv[1].as_int = nearest_mv[1].as_int;
      break;
    }
    case NEAR_NEARMV: {
      assert(is_compound);
      mv[0].as_int = near_mv[0].as_int;
      mv[1].as_int = near_mv[1].as_int;
      break;
    }
    case NEW_NEARESTMV: {
      nmv_context *const nmvc = &ec_ctx->nmvc;
      read_mv(r, &mv[0].as_mv, &ref_mv[0].as_mv, nmvc, allow_hp);
      assert(is_compound);
      mv[1].as_int = nearest_mv[1].as_int;
      break;
    }
    case NEAREST_NEWMV: {
      nmv_context *const nmvc = &ec_ctx->nmvc;
      mv[0].as_int = nearest_mv[0].as_int;
      read_mv(r, &mv[1].as_mv, &ref_mv[1].as_mv, nmvc, allow_hp);
      assert(is_compound);
      break;
    }
    case NEAR_NEWMV: {
      nmv_context *const nmvc = &ec_ctx->nmvc;
      mv[0].as_int = near_mv[0].as_int;
      read_mv(r, &mv[1].as_mv, &ref_mv[1].as_mv, nmvc, allow_hp);
      assert(is_compound);
      break;
    }
    case NEW_NEARMV: {
      nmv_context *const nmvc = &ec_ctx->nmvc;
      read_mv(r, &mv[0].as_mv, &ref_mv[0].as_mv, nmvc, allow_hp);
      assert(is_compound);
      mv[1].as_int = near_mv[1].as_int;
      break;
    }
    case GLOBAL_GLOBALMV: {
      assert(is_compound);
      mv[0].as_int = gm_get_motion_vector(&cm->global_motion[ref_frame[0]],
                                          features->allow_high_precision_mv,
                                          bsize, xd->mi_col, xd->mi_row,
                                          features->cur_frame_force_integer_mv)
                         .as_int;
      mv[1].as_int = gm_get_motion_vector(&cm->global_motion[ref_frame[1]],
                                          features->allow_high_precision_mv,
                                          bsize, xd->mi_col, xd->mi_row,
                                          features->cur_frame_force_integer_mv)
                         .as_int;
      break;
    }
    default: {
      return 0;
    }
  }

  int ret = is_mv_valid(&mv[0].as_mv);
  if (is_compound) {
    ret = ret && is_mv_valid(&mv[1].as_mv);
  }
  return ret;
}